

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_compareScalingFactorWithTwoUnitsBasedOnUnknownUnits_Test::TestBody
          (Units_compareScalingFactorWithTwoUnitsBasedOnUnknownUnits_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  UnitsPtr u2;
  UnitsPtr u1;
  long *local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  double local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Units::create();
  psVar1 = local_30;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"apple","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"");
  libcellml::Units::addUnit(local_30,(int)&local_88,1.0,1.0,(string *)0x0);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_40;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"banana","");
  pcVar3 = "";
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"","");
  libcellml::Units::addUnit(local_40,(int)&local_88,1.0,1.0,(string *)0x0);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  local_68[0] = (long *)0x0;
  local_48 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_30,(shared_ptr *)&local_40,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_88,"0.0","libcellml::Units::scalingFactor(u1, u2)",
             (double *)local_68,&local_48);
  if (local_88._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x463,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_68[0] != (long *)0x0)) {
        (**(code **)(*local_68[0] + 8))();
      }
      local_68[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Units, compareScalingFactorWithTwoUnitsBasedOnUnknownUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("apple", 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("banana", 0, 1.0, 1.0);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
}